

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O2

void __thiscall
pg::PSISolver::compute_all_val(PSISolver *this,WorkerP *__lace_worker,Task *__lace_dq_head)

{
  long lVar1;
  int iVar2;
  int i;
  long lVar3;
  bool bVar4;
  
  reset_done_CALL(__lace_worker,__lace_dq_head,0,(int)((this->super_Solver).game)->n_vertices);
  set_in_CALL(__lace_worker,__lace_dq_head,0,(int)((this->super_Solver).game)->n_vertices);
  iVar2 = 0;
  for (lVar3 = 0; lVar3 < ((this->super_Solver).game)->n_vertices; lVar3 = lVar3 + 1) {
    if ((*(int *)(done + lVar3 * 4) != 3) &&
       ((lVar1 = (long)*(int *)(str + lVar3 * 4), lVar1 == -1 || (*(int *)(halt + lVar1 * 4) != 0)))
       ) {
      compute_val_SPAWN(__lace_worker,__lace_dq_head,(int)lVar3,this);
      __lace_dq_head = __lace_dq_head + 1;
      iVar2 = iVar2 + 1;
    }
  }
  while( true ) {
    __lace_dq_head = __lace_dq_head + -1;
    bVar4 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar4) break;
    compute_val_SYNC(__lace_worker,__lace_dq_head);
  }
  return;
}

Assistant:

void
PSISolver::compute_all_val(WorkerP* __lace_worker, Task* __lace_dq_head)
{
    // reset "done" (for nodes that are not disabled or won)
    CALL(reset_done, 0, nodecount());
    CALL(set_in, 0, nodecount());
    // for all unsolved enabled nodes that go to sink, run compute val
    int count = 0;
    for (int i=0; i<nodecount(); i++) {
        if (done[i] == 3) continue;
        if (str[i] == -1 or halt[str[i]]) { // str[i] is -2 for disabled and not -1 for won
            SPAWN(compute_val, i, this);
            count++;
        }
    }
    while (count--) {
        SYNC(compute_val);
    }
}